

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_sqrt_sort_common_sort(int **arr,int Len,int **extbuf,int *Tags)

{
  int iVar1;
  int **in_RCX;
  int **in_RDX;
  int in_ESI;
  void *in_RDI;
  int cbuf;
  int lblock;
  undefined4 in_stack_00000018;
  int in_stack_00000028;
  int in_stack_0000002c;
  int **in_stack_00000030;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  int in_stack_ffffffffffffffdc;
  int L2;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 0x10) {
    stable_sqrt_sort_sort_ins(in_RCX,in_stack_ffffffffffffffdc);
  }
  else {
    for (L2 = 1; L2 * L2 < in_ESI; L2 = L2 << 1) {
    }
    memcpy(in_RDX,in_RDI,(long)L2 << 3);
    stable_sqrt_sort_common_sort
              ((int **)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
               in_RCX,(int *)CONCAT44(L2,in_stack_ffffffffffffffd8));
    stable_sqrt_sort_build_blocks(_cbuf,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    iVar2 = L2;
    while( true ) {
      iVar1 = iVar2 * 2;
      if (in_ESI == iVar1 || SBORROW4(in_ESI,iVar1) != in_ESI + iVar2 * -2 < 0) break;
      stable_sqrt_sort_combine_blocks
                (in_stack_00000030,in_stack_0000002c,in_stack_00000028,arr._4_4_,
                 (int *)CONCAT44(Len,in_stack_00000018));
      iVar2 = iVar1;
    }
    stable_sqrt_sort_merge_down((int **)((long)in_RDI + (long)L2 * 8),in_RDX,in_ESI - L2,L2);
  }
  return;
}

Assistant:

static void SQRT_SORT_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                                  int *Tags) {
  int lblock, cbuf;

  if (Len < 16) {
    SQRT_SORT_SORT_INS(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  SORT_TYPE_CPY(extbuf, arr, lblock);
  SQRT_SORT_COMMON_SORT(extbuf, lblock, arr, Tags);
  SQRT_SORT_BUILD_BLOCKS(arr + lblock, Len - lblock, lblock);
  cbuf = lblock;

  while (Len > (cbuf *= 2)) {
    SQRT_SORT_COMBINE_BLOCKS(arr + lblock, Len - lblock, cbuf, lblock, Tags);
  }

  SQRT_SORT_MERGE_DOWN(arr + lblock, extbuf, Len - lblock, lblock);
}